

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  const_reference pvVar5;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  undefined1 local_8e0 [8];
  string val;
  string key;
  cmatch m;
  undefined1 local_878 [8];
  stream_line_reader reader;
  char buf [2048];
  int bufsiz;
  Headers *headers_local;
  Stream *strm_local;
  
  if ((read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
       ::re_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                                   ::re_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                ::re_abi_cxx11_,"(.+?):\\s*(.+?)\\s*\\r\\n",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                         ::re_abi_cxx11_);
  }
  __stream = (FILE *)0x800;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_878,strm,reader.glowable_buffer_.field_2._M_local_buf + 8,
             0x800);
  __n = extraout_RDX;
  do {
    uVar3 = stream_line_reader::getline((stream_line_reader *)local_878,(char **)strm,__n,__stream);
    if ((uVar3 & 1) == 0) {
      strm_local._7_1_ = false;
LAB_001cfea7:
      stream_line_reader::~stream_line_reader((stream_line_reader *)local_878);
      return strm_local._7_1_;
    }
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_878);
    iVar2 = strcmp(pcVar4,"\r\n");
    if (iVar2 == 0) {
      strm_local._7_1_ = true;
      goto LAB_001cfea7;
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)((long)&key.field_2 + 8));
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_878);
    strm = (Stream *)((long)&key.field_2 + 8);
    __stream = (FILE *)0x0;
    bVar1 = std::
            regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                      (pcVar4,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               *)strm,
                       &read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                        ::re_abi_cxx11_,0);
    if (bVar1) {
      pvVar5 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)((long)&key.field_2 + 8),1);
      std::__cxx11::sub_match::operator_cast_to_string
                ((string_type *)((long)&val.field_2 + 8),(sub_match *)pvVar5);
      pvVar5 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)((long)&key.field_2 + 8),2);
      std::__cxx11::sub_match::operator_cast_to_string((string_type *)local_8e0,(sub_match *)pvVar5)
      ;
      strm = (Stream *)((long)&val.field_2 + 8);
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)headers,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strm,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0);
      std::__cxx11::string::~string((string *)local_8e0);
      std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
    }
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)((long)&key.field_2 + 8));
    __n = extraout_RDX_00;
  } while( true );
}

Assistant:

inline bool read_headers(Stream& strm, Headers& headers)
{
    static std::regex re(R"((.+?):\s*(.+?)\s*\r\n)");

    const auto bufsiz = 2048;
    char buf[bufsiz];

    stream_line_reader reader(strm, buf, bufsiz);

    for (;;) {
        if (!reader.getline()) {
            return false;
        }
        if (!strcmp(reader.ptr(), "\r\n")) {
            break;
        }
        std::cmatch m;
        if (std::regex_match(reader.ptr(), m, re)) {
            auto key = std::string(m[1]);
            auto val = std::string(m[2]);
            headers.emplace(key, val);
        }
    }

    return true;
}